

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_8.c
# Opt level: O0

void arr_store_si128(int8_t *array,__m128i vWH,int32_t i,int32_t s1Len,int32_t j,int32_t s2Len)

{
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  int32_t s2Len_local;
  int32_t j_local;
  int32_t s1Len_local;
  int32_t i_local;
  __m128i vWH_local;
  int8_t *array_local;
  
  if ((((-1 < (int)vWH[0]) && ((int)vWH[0] < (int)vWH[1])) && (-1 < i)) && (i < s1Len)) {
    vWH_local[0]._7_1_ = (int8_t)((uint)in_XMM0_Dd >> 0x18);
    array[(long)(int)vWH[0] * (long)s1Len + (long)i] = vWH_local[0]._7_1_;
  }
  if (((-1 < (int)vWH[0] + 1) && ((int)vWH[0] + 1 < (int)vWH[1])) &&
     ((-1 < i + -1 && (i + -1 < s1Len)))) {
    vWH_local[0]._6_1_ = (int8_t)((uint)in_XMM0_Dd >> 0x10);
    array[(long)((int)vWH[0] + 1) * (long)s1Len + (long)(i + -1)] = vWH_local[0]._6_1_;
  }
  if (((-1 < (int)vWH[0] + 2) && ((int)vWH[0] + 2 < (int)vWH[1])) &&
     ((-1 < i + -2 && (i + -2 < s1Len)))) {
    vWH_local[0]._5_1_ = (int8_t)((uint)in_XMM0_Dd >> 8);
    array[(long)((int)vWH[0] + 2) * (long)s1Len + (long)(i + -2)] = vWH_local[0]._5_1_;
  }
  if ((((-1 < (int)vWH[0] + 3) && ((int)vWH[0] + 3 < (int)vWH[1])) && (-1 < i + -3)) &&
     (i + -3 < s1Len)) {
    vWH_local[0]._4_1_ = (int8_t)in_XMM0_Dd;
    array[(long)((int)vWH[0] + 3) * (long)s1Len + (long)(i + -3)] = vWH_local[0]._4_1_;
  }
  if (((-1 < (int)vWH[0] + 4) && ((int)vWH[0] + 4 < (int)vWH[1])) &&
     ((-1 < i + -4 && (i + -4 < s1Len)))) {
    vWH_local[0]._3_1_ = (int8_t)((uint)in_XMM0_Dc >> 0x18);
    array[(long)((int)vWH[0] + 4) * (long)s1Len + (long)(i + -4)] = vWH_local[0]._3_1_;
  }
  if (((-1 < (int)vWH[0] + 5) && ((int)vWH[0] + 5 < (int)vWH[1])) &&
     ((-1 < i + -5 && (i + -5 < s1Len)))) {
    vWH_local[0]._2_1_ = (int8_t)((uint)in_XMM0_Dc >> 0x10);
    array[(long)((int)vWH[0] + 5) * (long)s1Len + (long)(i + -5)] = vWH_local[0]._2_1_;
  }
  if ((((-1 < (int)vWH[0] + 6) && ((int)vWH[0] + 6 < (int)vWH[1])) && (-1 < i + -6)) &&
     (i + -6 < s1Len)) {
    vWH_local[0]._1_1_ = (int8_t)((uint)in_XMM0_Dc >> 8);
    array[(long)((int)vWH[0] + 6) * (long)s1Len + (long)(i + -6)] = vWH_local[0]._1_1_;
  }
  if (((-1 < (int)vWH[0] + 7) && ((int)vWH[0] + 7 < (int)vWH[1])) &&
     ((-1 < i + -7 && (i + -7 < s1Len)))) {
    vWH_local[0]._0_1_ = (int8_t)in_XMM0_Dc;
    array[(long)((int)vWH[0] + 7) * (long)s1Len + (long)(i + -7)] = (int8_t)vWH_local[0];
  }
  if (((-1 < (int)vWH[0] + 8) && ((int)vWH[0] + 8 < (int)vWH[1])) &&
     ((-1 < i + -8 && (i + -8 < s1Len)))) {
    i_local._3_1_ = (int8_t)((uint)in_XMM0_Db >> 0x18);
    array[(long)((int)vWH[0] + 8) * (long)s1Len + (long)(i + -8)] = i_local._3_1_;
  }
  if ((((-1 < (int)vWH[0] + 9) && ((int)vWH[0] + 9 < (int)vWH[1])) && (-1 < i + -9)) &&
     (i + -9 < s1Len)) {
    i_local._2_1_ = (int8_t)((uint)in_XMM0_Db >> 0x10);
    array[(long)((int)vWH[0] + 9) * (long)s1Len + (long)(i + -9)] = i_local._2_1_;
  }
  if (((-1 < (int)vWH[0] + 10) && ((int)vWH[0] + 10 < (int)vWH[1])) &&
     ((-1 < i + -10 && (i + -10 < s1Len)))) {
    i_local._1_1_ = (int8_t)((uint)in_XMM0_Db >> 8);
    array[(long)((int)vWH[0] + 10) * (long)s1Len + (long)(i + -10)] = i_local._1_1_;
  }
  if (((-1 < (int)vWH[0] + 0xb) && ((int)vWH[0] + 0xb < (int)vWH[1])) &&
     ((-1 < i + -0xb && (i + -0xb < s1Len)))) {
    i_local._0_1_ = (int8_t)in_XMM0_Db;
    array[(long)((int)vWH[0] + 0xb) * (long)s1Len + (long)(i + -0xb)] = (int8_t)i_local;
  }
  if ((((-1 < (int)vWH[0] + 0xc) && ((int)vWH[0] + 0xc < (int)vWH[1])) && (-1 < i + -0xc)) &&
     (i + -0xc < s1Len)) {
    s1Len_local._3_1_ = (int8_t)((uint)in_XMM0_Da >> 0x18);
    array[(long)((int)vWH[0] + 0xc) * (long)s1Len + (long)(i + -0xc)] = s1Len_local._3_1_;
  }
  if (((-1 < (int)vWH[0] + 0xd) && ((int)vWH[0] + 0xd < (int)vWH[1])) &&
     ((-1 < i + -0xd && (i + -0xd < s1Len)))) {
    s1Len_local._2_1_ = (int8_t)((uint)in_XMM0_Da >> 0x10);
    array[(long)((int)vWH[0] + 0xd) * (long)s1Len + (long)(i + -0xd)] = s1Len_local._2_1_;
  }
  if (((-1 < (int)vWH[0] + 0xe) && ((int)vWH[0] + 0xe < (int)vWH[1])) &&
     ((-1 < i + -0xe && (i + -0xe < s1Len)))) {
    s1Len_local._1_1_ = (int8_t)((uint)in_XMM0_Da >> 8);
    array[(long)((int)vWH[0] + 0xe) * (long)s1Len + (long)(i + -0xe)] = s1Len_local._1_1_;
  }
  if ((((-1 < (int)vWH[0] + 0xf) && ((int)vWH[0] + 0xf < (int)vWH[1])) && (-1 < i + -0xf)) &&
     (i + -0xf < s1Len)) {
    s1Len_local._0_1_ = (int8_t)in_XMM0_Da;
    array[(long)((int)vWH[0] + 0xf) * (long)s1Len + (long)(i + -0xf)] = (int8_t)s1Len_local;
  }
  return;
}

Assistant:

static inline void arr_store_si128(
        int *array,
        __m128i vWH,
        int32_t i,
        int32_t s1Len,
        int32_t j,
        int32_t s2Len)
{
    if (0 <= i+0 && i+0 < s1Len && 0 <= j-0 && j-0 < s2Len) {
        array[1LL*(i+0)*s2Len + (j-0)] = (int8_t)_mm_extract_epi8_rpl(vWH, 15);
    }
    if (0 <= i+1 && i+1 < s1Len && 0 <= j-1 && j-1 < s2Len) {
        array[1LL*(i+1)*s2Len + (j-1)] = (int8_t)_mm_extract_epi8_rpl(vWH, 14);
    }
    if (0 <= i+2 && i+2 < s1Len && 0 <= j-2 && j-2 < s2Len) {
        array[1LL*(i+2)*s2Len + (j-2)] = (int8_t)_mm_extract_epi8_rpl(vWH, 13);
    }
    if (0 <= i+3 && i+3 < s1Len && 0 <= j-3 && j-3 < s2Len) {
        array[1LL*(i+3)*s2Len + (j-3)] = (int8_t)_mm_extract_epi8_rpl(vWH, 12);
    }
    if (0 <= i+4 && i+4 < s1Len && 0 <= j-4 && j-4 < s2Len) {
        array[1LL*(i+4)*s2Len + (j-4)] = (int8_t)_mm_extract_epi8_rpl(vWH, 11);
    }
    if (0 <= i+5 && i+5 < s1Len && 0 <= j-5 && j-5 < s2Len) {
        array[1LL*(i+5)*s2Len + (j-5)] = (int8_t)_mm_extract_epi8_rpl(vWH, 10);
    }
    if (0 <= i+6 && i+6 < s1Len && 0 <= j-6 && j-6 < s2Len) {
        array[1LL*(i+6)*s2Len + (j-6)] = (int8_t)_mm_extract_epi8_rpl(vWH, 9);
    }
    if (0 <= i+7 && i+7 < s1Len && 0 <= j-7 && j-7 < s2Len) {
        array[1LL*(i+7)*s2Len + (j-7)] = (int8_t)_mm_extract_epi8_rpl(vWH, 8);
    }
    if (0 <= i+8 && i+8 < s1Len && 0 <= j-8 && j-8 < s2Len) {
        array[1LL*(i+8)*s2Len + (j-8)] = (int8_t)_mm_extract_epi8_rpl(vWH, 7);
    }
    if (0 <= i+9 && i+9 < s1Len && 0 <= j-9 && j-9 < s2Len) {
        array[1LL*(i+9)*s2Len + (j-9)] = (int8_t)_mm_extract_epi8_rpl(vWH, 6);
    }
    if (0 <= i+10 && i+10 < s1Len && 0 <= j-10 && j-10 < s2Len) {
        array[1LL*(i+10)*s2Len + (j-10)] = (int8_t)_mm_extract_epi8_rpl(vWH, 5);
    }
    if (0 <= i+11 && i+11 < s1Len && 0 <= j-11 && j-11 < s2Len) {
        array[1LL*(i+11)*s2Len + (j-11)] = (int8_t)_mm_extract_epi8_rpl(vWH, 4);
    }
    if (0 <= i+12 && i+12 < s1Len && 0 <= j-12 && j-12 < s2Len) {
        array[1LL*(i+12)*s2Len + (j-12)] = (int8_t)_mm_extract_epi8_rpl(vWH, 3);
    }
    if (0 <= i+13 && i+13 < s1Len && 0 <= j-13 && j-13 < s2Len) {
        array[1LL*(i+13)*s2Len + (j-13)] = (int8_t)_mm_extract_epi8_rpl(vWH, 2);
    }
    if (0 <= i+14 && i+14 < s1Len && 0 <= j-14 && j-14 < s2Len) {
        array[1LL*(i+14)*s2Len + (j-14)] = (int8_t)_mm_extract_epi8_rpl(vWH, 1);
    }
    if (0 <= i+15 && i+15 < s1Len && 0 <= j-15 && j-15 < s2Len) {
        array[1LL*(i+15)*s2Len + (j-15)] = (int8_t)_mm_extract_epi8_rpl(vWH, 0);
    }
}